

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftplistparser.c
# Opt level: O1

size_t Curl_ftp_parselist(char *buffer,size_t size,size_t nmemb,void *connptr)

{
  uint *puVar1;
  byte *pbVar2;
  byte bVar3;
  byte bVar4;
  int *piVar5;
  size_t sVar6;
  long lVar7;
  uint uVar8;
  curlfiletype cVar9;
  int iVar10;
  CURLcode CVar11;
  char *pcVar12;
  curl_fileinfo *pcVar13;
  void *pvVar14;
  long lVar15;
  ushort **ppuVar16;
  int *piVar17;
  size_t __n;
  ulong uVar18;
  ulong uVar19;
  byte *pbVar20;
  ulong uVar21;
  bool bVar22;
  char *p;
  size_t local_58;
  char *local_40;
  size_t local_38;
  
  uVar18 = size * nmemb;
  piVar5 = (int *)**(undefined8 **)(*connptr + 0x8a90);
  sVar6 = uVar18;
  if (piVar5[3] == 0) {
    if ((uVar18 != 0) && (*piVar5 == 0)) {
      *piVar5 = ((byte)(*buffer - 0x30U) < 10) + 1;
    }
    local_38 = uVar18 + 1;
    uVar21 = 0;
    do {
      if (uVar18 <= uVar21) {
        return uVar18;
      }
      bVar3 = buffer[uVar21];
      if (*(long *)(piVar5 + 4) == 0) {
        pcVar13 = Curl_fileinfo_alloc();
        *(curl_fileinfo **)(piVar5 + 4) = pcVar13;
        if (pcVar13 == (curl_fileinfo *)0x0) {
          piVar5[3] = 0x1b;
        }
        else {
          pvVar14 = (*Curl_cmalloc)(0xa0);
          lVar15 = *(long *)(piVar5 + 4);
          *(void **)(lVar15 + 0x68) = pvVar14;
          if (pvVar14 != (void *)0x0) {
            *(undefined8 *)(lVar15 + 0x70) = 0xa0;
            piVar5[8] = 0;
            piVar5[9] = 0;
            piVar5[6] = 0;
            goto LAB_0049bc80;
          }
          lVar15 = **(long **)(*connptr + 0x8a90);
          if (*(void **)(lVar15 + 0x10) != (void *)0x0) {
            Curl_fileinfo_dtor((void *)0x0,*(void **)(lVar15 + 0x10));
          }
          *(undefined8 *)(lVar15 + 0x10) = 0;
          *(undefined4 *)(lVar15 + 0xc) = 0x1b;
        }
LAB_0049be88:
        bVar22 = false;
        local_58 = uVar18;
      }
      else {
LAB_0049bc80:
        pcVar13 = *(curl_fileinfo **)(piVar5 + 4);
        sVar6 = pcVar13->b_used;
        pcVar13->b_used = sVar6 + 1;
        pcVar13->b_data[sVar6] = bVar3;
        if (pcVar13->b_used < pcVar13->b_size - 1) {
LAB_0049bd84:
          uVar19 = (ulong)bVar3;
          if (*piVar5 == 2) {
            switch(piVar5[1]) {
            case 0:
              uVar8 = piVar5[6] + 1;
              piVar5[6] = uVar8;
              if (uVar8 < 9) {
                __n = 0xc;
                pcVar12 = "0123456789-";
LAB_0049c0a4:
                pvVar14 = memchr(pcVar12,(int)(char)bVar3,__n);
                bVar22 = pvVar14 == (void *)0x0;
LAB_0049c0ac:
                if (bVar22) goto LAB_0049c0b7;
              }
              else {
                if ((uVar8 != 9) || (bVar3 != 0x20)) goto LAB_0049c0b7;
                piVar5[1] = 1;
                piVar5[2] = 0;
              }
              break;
            case 1:
              iVar10 = piVar5[6];
              piVar5[6] = iVar10 + 1U;
              if (piVar5[2] == 1) {
                if (bVar3 == 0x20) {
                  *(long *)(piVar5 + 0x10) = *(long *)(piVar5 + 8);
                  pcVar13->b_data[((ulong)(iVar10 + 1U) - 1) + *(long *)(piVar5 + 8)] = '\0';
                  piVar5[1] = 2;
                  piVar5[2] = 0;
LAB_0049c2dd:
                  piVar5[6] = 0;
                }
                else {
                  pvVar14 = memchr("APM0123456789:",(int)(char)bVar3,0xf);
                  if (pvVar14 == (void *)0x0) goto LAB_0049c83a;
                }
              }
              else if ((piVar5[2] == 0) &&
                      (ppuVar16 = __ctype_b_loc(),
                      (*(byte *)((long)*ppuVar16 + uVar19 * 2 + 1) & 0x20) == 0)) goto LAB_0049bfcc;
              break;
            case 2:
              iVar10 = piVar5[2];
              if (iVar10 != 1) goto LAB_0049c289;
              iVar10 = piVar5[6];
              piVar5[6] = iVar10 + 1U;
              if (bVar3 != 0x20) break;
              pcVar13->b_data[((ulong)(iVar10 + 1U) - 1) + *(long *)(piVar5 + 8)] = '\0';
              pcVar12 = pcVar13->b_data;
              lVar15 = *(long *)(piVar5 + 8);
              iVar10 = strcmp("<DIR>",pcVar12 + lVar15);
              if (iVar10 == 0) {
                pcVar13->filetype = CURLFILETYPE_DIRECTORY;
                pcVar13->size = 0;
              }
              else {
                lVar15 = strtol(pcVar12 + lVar15,&local_40,10);
                pcVar13->size = lVar15;
                if (*local_40 == '\0') {
                  if ((lVar15 + 0x8000000000000001U < 2) &&
                     (piVar17 = __errno_location(), *piVar17 == 0x22)) {
                    lVar15 = **(long **)(*connptr + 0x8a90);
                    pvVar14 = *(void **)(lVar15 + 0x10);
                    goto joined_r0x0049c8df;
                  }
                  *(undefined4 *)(*(long *)(piVar5 + 4) + 8) = 0;
                  bVar22 = true;
                }
                else {
                  lVar15 = **(long **)(*connptr + 0x8a90);
                  pvVar14 = *(void **)(lVar15 + 0x10);
joined_r0x0049c8df:
                  if (pvVar14 != (void *)0x0) {
                    Curl_fileinfo_dtor((void *)0x0,pvVar14);
                  }
                  *(undefined8 *)(lVar15 + 0x10) = 0;
                  *(undefined4 *)(lVar15 + 0xc) = 0x57;
                  bVar22 = false;
                  local_58 = uVar18;
                }
                if (!bVar22) goto LAB_0049c9fd;
              }
              *(uint *)(*(long *)(piVar5 + 4) + 0x60) =
                   *(uint *)(*(long *)(piVar5 + 4) + 0x60) | 0x40;
              piVar5[6] = 0;
              piVar5[1] = 3;
              piVar5[2] = 0;
              break;
            case 3:
              iVar10 = piVar5[2];
              if (iVar10 == 2) {
                if (bVar3 != 10) goto LAB_0049c7ed;
              }
              else {
                if (iVar10 != 1) goto LAB_0049c289;
                piVar5[6] = piVar5[6] + 1;
                if (bVar3 != 10) {
                  if (bVar3 == 0xd) {
                    piVar5[2] = 2;
                    pcVar13->b_data[pcVar13->b_used - 1] = '\0';
                  }
                  break;
                }
                *(undefined8 *)(piVar5 + 10) = *(undefined8 *)(piVar5 + 8);
                pcVar13->b_data[pcVar13->b_used - 1] = '\0';
              }
              *(undefined8 *)(piVar5 + 10) = *(undefined8 *)(piVar5 + 8);
              CVar11 = ftp_pl_insert_finfo((connectdata *)connptr,pcVar13);
              if (CVar11 != CURLE_OK) {
LAB_0049caa3:
                lVar15 = **(long **)(*connptr + 0x8a90);
                if (*(void **)(lVar15 + 0x10) != (void *)0x0) {
                  Curl_fileinfo_dtor((void *)0x0,*(void **)(lVar15 + 0x10));
                }
                *(undefined8 *)(lVar15 + 0x10) = 0;
                *(CURLcode *)(lVar15 + 0xc) = CVar11;
                local_58 = uVar18;
                goto LAB_0049be3d;
              }
              piVar5[1] = 0;
              piVar5[2] = 0;
            }
            goto switchD_0049bdb9_default;
          }
          if (*piVar5 != 1) {
            local_58 = local_38;
            goto LAB_0049be3d;
          }
          switch(piVar5[1]) {
          case 0:
            if (piVar5[2] == 1) {
              uVar8 = piVar5[6];
              piVar5[6] = uVar8 + 1;
              if (bVar3 == 10) {
                pcVar13->b_data[uVar8] = '\0';
                pcVar12 = pcVar13->b_data;
                iVar10 = strncmp("total ",pcVar12,6);
                if (iVar10 != 0) goto LAB_0049c7ed;
                ppuVar16 = __ctype_b_loc();
                pbVar20 = (byte *)(pcVar12 + 5);
                do {
                  pbVar2 = pbVar20 + 1;
                  pbVar20 = pbVar20 + 1;
                } while ((*(byte *)((long)*ppuVar16 + (ulong)*pbVar2 * 2 + 1) & 0x20) != 0);
                do {
                  bVar3 = *pbVar20;
                  pbVar20 = pbVar20 + 1;
                } while ((*(byte *)((long)*ppuVar16 + (ulong)bVar3 * 2 + 1) & 8) != 0);
                if (bVar3 == 0) {
                  piVar5[1] = 1;
                  pcVar13->b_used = 0;
                }
                else {
                  lVar15 = **(long **)(*connptr + 0x8a90);
                  if (*(void **)(lVar15 + 0x10) != (void *)0x0) {
                    Curl_fileinfo_dtor((void *)0x0,*(void **)(lVar15 + 0x10));
                  }
                  *(undefined8 *)(lVar15 + 0x10) = 0;
                  *(undefined4 *)(lVar15 + 0xc) = 0x57;
                  local_58 = uVar18;
                }
                if (bVar3 != 0) goto LAB_0049c9fd;
              }
              else if (bVar3 == 0xd) {
                piVar5[6] = uVar8;
                pcVar13->b_used = pcVar13->b_used - 1;
              }
            }
            else if (piVar5[2] == 0) {
              if (bVar3 == 0x74) {
                piVar5[2] = 1;
                piVar5[6] = piVar5[6] + 1;
              }
              else {
                piVar5[1] = 1;
                pcVar13->b_used = 0;
                uVar21 = uVar21 - 1;
              }
            }
            break;
          case 1:
            if (bVar3 < 100) {
              if (bVar3 < 0x62) {
                cVar9 = CURLFILETYPE_FILE;
                if (bVar3 != 0x2d) {
                  if (bVar3 != 0x44) goto LAB_0049c7ed;
                  cVar9 = CURLFILETYPE_DOOR;
                }
              }
              else if (bVar3 == 0x62) {
                cVar9 = CURLFILETYPE_DEVICE_BLOCK;
              }
              else {
                if (bVar3 != 99) goto LAB_0049c7ed;
                cVar9 = CURLFILETYPE_DEVICE_CHAR;
              }
            }
            else if (bVar3 < 0x70) {
              if (bVar3 == 100) {
                cVar9 = CURLFILETYPE_DIRECTORY;
              }
              else {
                if (bVar3 != 0x6c) goto LAB_0049c7ed;
                cVar9 = CURLFILETYPE_SYMLINK;
              }
            }
            else if (bVar3 == 0x70) {
              cVar9 = CURLFILETYPE_NAMEDPIPE;
            }
            else {
              if (bVar3 != 0x73) goto LAB_0049c7ed;
              cVar9 = CURLFILETYPE_SOCKET;
            }
            pcVar13->filetype = cVar9;
            piVar5[1] = 2;
            piVar5[6] = 0;
            piVar5[8] = 1;
            piVar5[9] = 0;
            break;
          case 2:
            uVar8 = piVar5[6] + 1;
            piVar5[6] = uVar8;
            if (uVar8 < 10) {
              __n = 9;
              pcVar12 = "rwx-tTsS";
              goto LAB_0049c0a4;
            }
            if (uVar8 != 10) break;
            if (bVar3 == 0x20) {
              pcVar13->b_data[10] = '\0';
              lVar15 = *(long *)(piVar5 + 8);
              uVar8 = ftp_pl_get_permission(pcVar13->b_data + lVar15);
              if (uVar8 < 0x1000000) {
                lVar7 = *(long *)(piVar5 + 4);
                puVar1 = (uint *)(lVar7 + 0x60);
                *puVar1 = *puVar1 | 8;
                *(uint *)(lVar7 + 0x18) = uVar8;
                *(long *)(piVar5 + 0x12) = lVar15;
                piVar5[6] = 0;
                piVar5[1] = 3;
                piVar5[2] = 0;
                bVar22 = true;
              }
              else {
                lVar15 = **(long **)(*connptr + 0x8a90);
                if (*(void **)(lVar15 + 0x10) != (void *)0x0) {
                  Curl_fileinfo_dtor((void *)0x0,*(void **)(lVar15 + 0x10));
                }
                *(undefined8 *)(lVar15 + 0x10) = 0;
                *(undefined4 *)(lVar15 + 0xc) = 0x57;
                bVar22 = false;
                local_58 = uVar18;
              }
            }
            else {
              lVar15 = **(long **)(*connptr + 0x8a90);
              if (*(void **)(lVar15 + 0x10) != (void *)0x0) {
                Curl_fileinfo_dtor((void *)0x0,*(void **)(lVar15 + 0x10));
              }
              *(undefined8 *)(lVar15 + 0x10) = 0;
              *(undefined4 *)(lVar15 + 0xc) = 0x57;
              bVar22 = false;
              local_58 = uVar18;
            }
            if (bVar22) break;
LAB_0049c9fd:
            bVar22 = false;
            goto LAB_0049c79c;
          case 3:
            iVar10 = piVar5[2];
            if (iVar10 == 1) {
              iVar10 = piVar5[6];
              piVar5[6] = iVar10 + 1U;
              if (bVar3 == 0x20) {
                pcVar13->b_data[((ulong)(iVar10 + 1U) - 1) + *(long *)(piVar5 + 8)] = '\0';
                lVar15 = strtol(pcVar13->b_data + *(long *)(piVar5 + 8),&local_40,10);
                if ((*local_40 == '\0') && (lVar15 + 0x7fffffffffffffffU < 0xfffffffffffffffe)) {
                  lVar7 = *(long *)(piVar5 + 4);
                  puVar1 = (uint *)(lVar7 + 0x60);
                  *puVar1 = *puVar1 | 0x80;
                  *(long *)(lVar7 + 0x30) = lVar15;
                }
                piVar5[6] = 0;
                piVar5[8] = 0;
                piVar5[9] = 0;
                piVar5[1] = 4;
                piVar5[2] = 0;
              }
              else if ((byte)(bVar3 - 0x3a) < 0xf6) goto LAB_0049c0b7;
            }
            else {
LAB_0049c252:
              if ((iVar10 == 0) && (bVar3 != 0x20)) {
                if (9 < (byte)(bVar3 - 0x30)) goto LAB_0049c83a;
LAB_0049c29b:
                *(size_t *)(piVar5 + 8) = pcVar13->b_used - 1;
                piVar5[6] = 1;
                piVar5[2] = 1;
              }
            }
            break;
          case 4:
            iVar10 = piVar5[2];
            if (iVar10 == 1) {
              iVar10 = piVar5[6];
              piVar5[6] = iVar10 + 1U;
              if (bVar3 == 0x20) {
                pcVar13->b_data[((ulong)(iVar10 + 1U) - 1) + *(long *)(piVar5 + 8)] = '\0';
                *(undefined8 *)(piVar5 + 0xc) = *(undefined8 *)(piVar5 + 8);
                piVar5[1] = 5;
                piVar5[2] = 0;
LAB_0049c238:
                piVar5[8] = 0;
                piVar5[9] = 0;
                goto LAB_0049c2dd;
              }
            }
            else {
LAB_0049c289:
              if (iVar10 == 0) goto switchD_0049c05f_caseD_0;
            }
            break;
          case 5:
            iVar10 = piVar5[2];
            if (iVar10 != 1) goto LAB_0049c289;
            iVar10 = piVar5[6];
            piVar5[6] = iVar10 + 1U;
            if (bVar3 == 0x20) {
              pcVar13->b_data[((ulong)(iVar10 + 1U) - 1) + *(long *)(piVar5 + 8)] = '\0';
              *(undefined8 *)(piVar5 + 0xe) = *(undefined8 *)(piVar5 + 8);
              piVar5[1] = 6;
              piVar5[2] = 0;
              goto LAB_0049c238;
            }
            break;
          case 6:
            iVar10 = piVar5[2];
            if (iVar10 != 1) goto LAB_0049c252;
            iVar10 = piVar5[6];
            piVar5[6] = iVar10 + 1U;
            if (bVar3 != 0x20) {
              ppuVar16 = __ctype_b_loc();
              bVar22 = (*(byte *)((long)*ppuVar16 + uVar19 * 2 + 1) & 8) == 0;
              goto LAB_0049c0ac;
            }
            pcVar13->b_data[((ulong)(iVar10 + 1U) - 1) + *(long *)(piVar5 + 8)] = '\0';
            lVar15 = strtol(pcVar13->b_data + *(long *)(piVar5 + 8),&local_40,10);
            if ((*local_40 == '\0') && (lVar15 + 0x7fffffffffffffffU < 0xfffffffffffffffe)) {
              lVar7 = *(long *)(piVar5 + 4);
              puVar1 = (uint *)(lVar7 + 0x60);
              *puVar1 = *puVar1 | 0x40;
              *(long *)(lVar7 + 0x28) = lVar15;
            }
            piVar5[6] = 0;
            piVar5[8] = 0;
            piVar5[9] = 0;
            piVar5[1] = 7;
            piVar5[2] = 0;
            break;
          case 7:
            switch(piVar5[2]) {
            case 0:
              if (bVar3 != 0x20) {
                ppuVar16 = __ctype_b_loc();
                if (((*ppuVar16)[uVar19] & 8) == 0) goto LAB_0049c83a;
                goto LAB_0049c29b;
              }
              break;
            case 1:
              piVar5[6] = piVar5[6] + 1;
              if (bVar3 == 0x20) {
                piVar5[2] = 2;
              }
              else {
                ppuVar16 = __ctype_b_loc();
                bVar4 = (byte)(*ppuVar16)[uVar19];
joined_r0x0049c5db:
                if (((bVar4 & 8) == 0) && (bVar3 != 0x2e)) goto LAB_0049c0b7;
              }
              break;
            case 2:
              piVar5[6] = piVar5[6] + 1;
              if (bVar3 != 0x20) {
                ppuVar16 = __ctype_b_loc();
                if (((*ppuVar16)[uVar19] & 8) == 0) goto LAB_0049c0b7;
LAB_0049c728:
                piVar5[2] = 3;
              }
              break;
            case 3:
              piVar5[6] = piVar5[6] + 1;
              if (bVar3 != 0x20) {
                ppuVar16 = __ctype_b_loc();
                bVar4 = (byte)(*ppuVar16)[uVar19];
                goto joined_r0x0049c5db;
              }
LAB_0049c759:
              piVar5[2] = 4;
              break;
            case 4:
              piVar5[6] = piVar5[6] + 1;
              if (bVar3 != 0x20) {
                ppuVar16 = __ctype_b_loc();
                if (((*ppuVar16)[uVar19] & 8) == 0) goto LAB_0049c0b7;
                piVar5[2] = 5;
              }
              break;
            case 5:
              iVar10 = piVar5[6];
              piVar5[6] = iVar10 + 1U;
              if (bVar3 == 0x20) {
                pcVar13->b_data[((ulong)(iVar10 + 1U) - 1) + *(long *)(piVar5 + 8)] = '\0';
                *(undefined8 *)(piVar5 + 0x10) = *(undefined8 *)(piVar5 + 8);
                if (pcVar13->filetype == CURLFILETYPE_SYMLINK) {
                  piVar5[1] = 9;
                  piVar5[2] = 0;
                }
                else {
                  piVar5[1] = 8;
                  piVar5[2] = 0;
                }
              }
              else {
                ppuVar16 = __ctype_b_loc();
                if (((((*ppuVar16)[uVar19] & 8) == 0) && (bVar3 != 0x2e)) && (bVar3 != 0x3a))
                goto LAB_0049c0b7;
              }
            }
            break;
          case 8:
            iVar10 = piVar5[2];
            if (iVar10 == 2) {
              if (bVar3 != 10) goto LAB_0049c7ed;
              pcVar13->b_data[(ulong)(uint)piVar5[6] + *(long *)(piVar5 + 8)] = '\0';
            }
            else {
              if (iVar10 != 1) goto LAB_0049c289;
              iVar10 = piVar5[6];
              uVar8 = iVar10 + 1;
              piVar5[6] = uVar8;
              if (bVar3 != 10) {
                if (bVar3 == 0xd) {
                  piVar5[6] = iVar10;
                  goto LAB_0049c4ac;
                }
                break;
              }
              pcVar13->b_data[((ulong)uVar8 - 1) + *(long *)(piVar5 + 8)] = '\0';
            }
            *(undefined8 *)(piVar5 + 10) = *(undefined8 *)(piVar5 + 8);
            piVar5[1] = 1;
            CVar11 = ftp_pl_insert_finfo((connectdata *)connptr,pcVar13);
            if (CVar11 != CURLE_OK) goto LAB_0049caa3;
            break;
          case 9:
            switch(piVar5[2]) {
            case 0:
switchD_0049c05f_caseD_0:
              if (bVar3 != 0x20) goto LAB_0049c29b;
              break;
            case 1:
              piVar5[6] = piVar5[6] + 1;
              if ((bVar3 == 10) || (bVar3 == 0xd)) goto LAB_0049c0b7;
              if (bVar3 == 0x20) {
LAB_0049c4ac:
                piVar5[2] = 2;
              }
              break;
            case 2:
              piVar5[6] = piVar5[6] + 1;
              if ((bVar3 == 10) || (bVar3 == 0xd)) goto LAB_0049c0b7;
              if (bVar3 == 0x2d) goto LAB_0049c728;
LAB_0049bfcc:
              piVar5[2] = 1;
              break;
            case 3:
              piVar5[6] = piVar5[6] + 1;
              if ((bVar3 != 10) && (bVar3 != 0xd)) {
                if (bVar3 == 0x3e) goto LAB_0049c759;
                goto LAB_0049bfcc;
              }
LAB_0049c0b7:
              lVar15 = **(long **)(*connptr + 0x8a90);
              pvVar14 = *(void **)(lVar15 + 0x10);
joined_r0x0049c858:
              if (pvVar14 != (void *)0x0) {
                Curl_fileinfo_dtor((void *)0x0,pvVar14);
              }
              *(undefined8 *)(lVar15 + 0x10) = 0;
              *(undefined4 *)(lVar15 + 0xc) = 0x57;
              goto LAB_0049be88;
            case 4:
              iVar10 = piVar5[6];
              piVar5[6] = iVar10 + 1U;
              if ((bVar3 == 10) || (bVar3 == 0xd)) goto LAB_0049c7ed;
              if (bVar3 == 0x20) {
                piVar5[2] = 5;
                pcVar13->b_data[((ulong)(iVar10 + 1U) - 4) + *(long *)(piVar5 + 8)] = '\0';
                *(undefined8 *)(piVar5 + 10) = *(undefined8 *)(piVar5 + 8);
                piVar5[6] = 0;
                piVar5[8] = 0;
                piVar5[9] = 0;
              }
              else {
                piVar5[2] = 1;
              }
              break;
            case 5:
              if ((bVar3 == 10) || (bVar3 == 0xd)) {
LAB_0049c83a:
                lVar15 = **(long **)(*connptr + 0x8a90);
                pvVar14 = *(void **)(lVar15 + 0x10);
                goto joined_r0x0049c858;
              }
              piVar5[2] = 6;
              *(size_t *)(piVar5 + 8) = pcVar13->b_used - 1;
              piVar5[6] = 1;
              break;
            case 6:
              iVar10 = piVar5[6];
              uVar8 = iVar10 + 1;
              piVar5[6] = uVar8;
              if (bVar3 == 10) {
                pcVar13->b_data[((ulong)uVar8 - 1) + *(long *)(piVar5 + 8)] = '\0';
LAB_0049ca87:
                *(undefined8 *)(piVar5 + 0x14) = *(undefined8 *)(piVar5 + 8);
                CVar11 = ftp_pl_insert_finfo((connectdata *)connptr,pcVar13);
                if (CVar11 != CURLE_OK) goto LAB_0049caa3;
                piVar5[1] = 1;
              }
              else if (bVar3 == 0xd) {
                piVar5[6] = iVar10;
                piVar5[2] = 7;
              }
              break;
            case 7:
              if (bVar3 == 10) {
                pcVar13->b_data[((ulong)(uint)piVar5[6] - 1) + *(long *)(piVar5 + 8)] = '\0';
                goto LAB_0049ca87;
              }
LAB_0049c7ed:
              lVar15 = **(long **)(*connptr + 0x8a90);
              if (*(void **)(lVar15 + 0x10) != (void *)0x0) {
                Curl_fileinfo_dtor((void *)0x0,*(void **)(lVar15 + 0x10));
              }
              *(undefined8 *)(lVar15 + 0x10) = 0;
              *(undefined4 *)(lVar15 + 0xc) = 0x57;
              local_58 = uVar18;
              goto LAB_0049be3d;
            }
          }
switchD_0049bdb9_default:
          uVar21 = uVar21 + 1;
          bVar22 = true;
        }
        else {
          pcVar12 = (char *)(*Curl_crealloc)(pcVar13->b_data,pcVar13->b_size + 0xa0);
          if (pcVar12 == (char *)0x0) {
            Curl_fileinfo_dtor((void *)0x0,*(void **)(piVar5 + 4));
            piVar5[4] = 0;
            piVar5[5] = 0;
            piVar5[3] = 0x1b;
            lVar15 = **(long **)(*connptr + 0x8a90);
            if (*(void **)(lVar15 + 0x10) != (void *)0x0) {
              Curl_fileinfo_dtor((void *)0x0,*(void **)(lVar15 + 0x10));
            }
            *(undefined8 *)(lVar15 + 0x10) = 0;
            *(undefined4 *)(lVar15 + 0xc) = 0x1b;
            local_58 = uVar18;
          }
          else {
            pcVar13->b_size = pcVar13->b_size + 0xa0;
            pcVar13->b_data = pcVar12;
          }
          if (pcVar12 != (char *)0x0) goto LAB_0049bd84;
LAB_0049be3d:
          bVar22 = false;
        }
      }
LAB_0049c79c:
      sVar6 = local_58;
    } while (bVar22);
  }
  local_58 = sVar6;
  return local_58;
}

Assistant:

size_t Curl_ftp_parselist(char *buffer, size_t size, size_t nmemb,
                          void *connptr)
{
  size_t bufflen = size*nmemb;
  struct connectdata *conn = (struct connectdata *)connptr;
  struct ftp_wc_tmpdata *tmpdata = conn->data->wildcard.tmp;
  struct ftp_parselist_data *parser = tmpdata->parser;
  struct curl_fileinfo *finfo;
  unsigned long i = 0;
  CURLcode rc;

  if(parser->error) { /* error in previous call */
    /* scenario:
     * 1. call => OK..
     * 2. call => OUT_OF_MEMORY (or other error)
     * 3. (last) call => is skipped RIGHT HERE and the error is hadled later
     *    in wc_statemach()
     */
    return bufflen;
  }

  if(parser->os_type == OS_TYPE_UNKNOWN && bufflen > 0) {
    /* considering info about FILE response format */
    parser->os_type = (buffer[0] >= '0' && buffer[0] <= '9') ?
                       OS_TYPE_WIN_NT : OS_TYPE_UNIX;
  }

  while(i < bufflen) { /* FSM */

    char c = buffer[i];
    if(!parser->file_data) { /* tmp file data is not allocated yet */
      parser->file_data = Curl_fileinfo_alloc();
      if(!parser->file_data) {
        parser->error = CURLE_OUT_OF_MEMORY;
        return bufflen;
      }
      parser->file_data->b_data = malloc(FTP_BUFFER_ALLOCSIZE);
      if(!parser->file_data->b_data) {
        PL_ERROR(conn, CURLE_OUT_OF_MEMORY);
        return bufflen;
      }
      parser->file_data->b_size = FTP_BUFFER_ALLOCSIZE;
      parser->item_offset = 0;
      parser->item_length = 0;
    }

    finfo = parser->file_data;
    finfo->b_data[finfo->b_used++] = c;

    if(finfo->b_used >= finfo->b_size - 1) {
      /* if it is important, extend buffer space for file data */
      char *tmp = realloc(finfo->b_data,
                          finfo->b_size + FTP_BUFFER_ALLOCSIZE);
      if(tmp) {
        finfo->b_size += FTP_BUFFER_ALLOCSIZE;
        finfo->b_data = tmp;
      }
      else {
        Curl_fileinfo_dtor(NULL, parser->file_data);
        parser->file_data = NULL;
        parser->error = CURLE_OUT_OF_MEMORY;
        PL_ERROR(conn, CURLE_OUT_OF_MEMORY);
        return bufflen;
      }
    }

    switch (parser->os_type) {
    case OS_TYPE_UNIX:
      switch (parser->state.UNIX.main) {
      case PL_UNIX_TOTALSIZE:
        switch(parser->state.UNIX.sub.total_dirsize) {
        case PL_UNIX_TOTALSIZE_INIT:
          if(c == 't') {
            parser->state.UNIX.sub.total_dirsize = PL_UNIX_TOTALSIZE_READING;
            parser->item_length++;
          }
          else {
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            /* start FSM again not considering size of directory */
            finfo->b_used = 0;
            i--;
          }
          break;
        case PL_UNIX_TOTALSIZE_READING:
          parser->item_length++;
          if(c == '\r') {
            parser->item_length--;
            finfo->b_used--;
          }
          else if(c == '\n') {
            finfo->b_data[parser->item_length - 1] = 0;
            if(strncmp("total ", finfo->b_data, 6) == 0) {
              char *endptr = finfo->b_data+6;
              /* here we can deal with directory size, pass the leading white
                 spaces and then the digits */
              while(ISSPACE(*endptr))
                endptr++;
              while(ISDIGIT(*endptr))
                endptr++;
              if(*endptr != 0) {
                PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
                return bufflen;
              }
              else {
                parser->state.UNIX.main = PL_UNIX_FILETYPE;
                finfo->b_used = 0;
              }
            }
            else {
              PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
              return bufflen;
            }
          }
          break;
        }
        break;
      case PL_UNIX_FILETYPE:
        switch (c) {
        case '-':
          finfo->filetype = CURLFILETYPE_FILE;
          break;
        case 'd':
          finfo->filetype = CURLFILETYPE_DIRECTORY;
          break;
        case 'l':
          finfo->filetype = CURLFILETYPE_SYMLINK;
          break;
        case 'p':
          finfo->filetype = CURLFILETYPE_NAMEDPIPE;
          break;
        case 's':
          finfo->filetype = CURLFILETYPE_SOCKET;
          break;
        case 'c':
          finfo->filetype = CURLFILETYPE_DEVICE_CHAR;
          break;
        case 'b':
          finfo->filetype = CURLFILETYPE_DEVICE_BLOCK;
          break;
        case 'D':
          finfo->filetype = CURLFILETYPE_DOOR;
          break;
        default:
          PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
          return bufflen;
        }
        parser->state.UNIX.main = PL_UNIX_PERMISSION;
        parser->item_length = 0;
        parser->item_offset = 1;
        break;
      case PL_UNIX_PERMISSION:
        parser->item_length++;
        if(parser->item_length <= 9) {
          if(!strchr("rwx-tTsS", c)) {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
        }
        else if(parser->item_length == 10) {
          unsigned int perm;
          if(c != ' ') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          finfo->b_data[10] = 0; /* terminate permissions */
          perm = ftp_pl_get_permission(finfo->b_data + parser->item_offset);
          if(perm & FTP_LP_MALFORMATED_PERM) {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          parser->file_data->flags |= CURLFINFOFLAG_KNOWN_PERM;
          parser->file_data->perm = perm;
          parser->offsets.perm = parser->item_offset;

          parser->item_length = 0;
          parser->state.UNIX.main = PL_UNIX_HLINKS;
          parser->state.UNIX.sub.hlinks = PL_UNIX_HLINKS_PRESPACE;
        }
        break;
      case PL_UNIX_HLINKS:
        switch(parser->state.UNIX.sub.hlinks) {
        case PL_UNIX_HLINKS_PRESPACE:
          if(c != ' ') {
            if(c >= '0' && c <= '9') {
              parser->item_offset = finfo->b_used - 1;
              parser->item_length = 1;
              parser->state.UNIX.sub.hlinks = PL_UNIX_HLINKS_NUMBER;
            }
            else {
              PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
              return bufflen;
            }
          }
          break;
        case PL_UNIX_HLINKS_NUMBER:
          parser->item_length ++;
          if(c == ' ') {
            char *p;
            long int hlinks;
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            hlinks = strtol(finfo->b_data + parser->item_offset, &p, 10);
            if(p[0] == '\0' && hlinks != LONG_MAX && hlinks != LONG_MIN) {
              parser->file_data->flags |= CURLFINFOFLAG_KNOWN_HLINKCOUNT;
              parser->file_data->hardlinks = hlinks;
            }
            parser->item_length = 0;
            parser->item_offset = 0;
            parser->state.UNIX.main = PL_UNIX_USER;
            parser->state.UNIX.sub.user = PL_UNIX_USER_PRESPACE;
          }
          else if(c < '0' || c > '9') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      case PL_UNIX_USER:
        switch(parser->state.UNIX.sub.user) {
        case PL_UNIX_USER_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.user = PL_UNIX_USER_PARSING;
          }
          break;
        case PL_UNIX_USER_PARSING:
          parser->item_length++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.user = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_GROUP;
            parser->state.UNIX.sub.group = PL_UNIX_GROUP_PRESPACE;
            parser->item_offset = 0;
            parser->item_length = 0;
          }
          break;
        }
        break;
      case PL_UNIX_GROUP:
        switch(parser->state.UNIX.sub.group) {
        case PL_UNIX_GROUP_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.group = PL_UNIX_GROUP_NAME;
          }
          break;
        case PL_UNIX_GROUP_NAME:
          parser->item_length++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.group = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_SIZE;
            parser->state.UNIX.sub.size = PL_UNIX_SIZE_PRESPACE;
            parser->item_offset = 0;
            parser->item_length = 0;
          }
          break;
        }
        break;
      case PL_UNIX_SIZE:
        switch(parser->state.UNIX.sub.size) {
        case PL_UNIX_SIZE_PRESPACE:
          if(c != ' ') {
            if(c >= '0' && c <= '9') {
              parser->item_offset = finfo->b_used - 1;
              parser->item_length = 1;
              parser->state.UNIX.sub.size = PL_UNIX_SIZE_NUMBER;
            }
            else {
              PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
              return bufflen;
            }
          }
          break;
        case PL_UNIX_SIZE_NUMBER:
          parser->item_length++;
          if(c == ' ') {
            char *p;
            curl_off_t fsize;
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            fsize = curlx_strtoofft(finfo->b_data+parser->item_offset, &p, 10);
            if(p[0] == '\0' && fsize != CURL_OFF_T_MAX &&
                               fsize != CURL_OFF_T_MIN) {
              parser->file_data->flags |= CURLFINFOFLAG_KNOWN_SIZE;
              parser->file_data->size = fsize;
            }
            parser->item_length = 0;
            parser->item_offset = 0;
            parser->state.UNIX.main = PL_UNIX_TIME;
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART1;
          }
          else if(!ISDIGIT(c)) {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      case PL_UNIX_TIME:
        switch(parser->state.UNIX.sub.time) {
        case PL_UNIX_TIME_PREPART1:
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->item_offset = finfo->b_used -1;
              parser->item_length = 1;
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART1;
            }
            else {
              PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
              return bufflen;
            }
          }
          break;
        case PL_UNIX_TIME_PART1:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART2;
          }
          else if(!ISALNUM(c) && c != '.') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        case PL_UNIX_TIME_PREPART2:
          parser->item_length++;
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART2;
            }
            else {
              PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
              return bufflen;
            }
          }
          break;
        case PL_UNIX_TIME_PART2:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART3;
          }
          else if(!ISALNUM(c) && c != '.') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        case PL_UNIX_TIME_PREPART3:
          parser->item_length++;
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART3;
            }
            else {
              PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
              return bufflen;
            }
          }
          break;
        case PL_UNIX_TIME_PART3:
          parser->item_length++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length -1] = 0;
            parser->offsets.time = parser->item_offset;
            if(ftp_pl_gettime(parser, finfo->b_data + parser->item_offset)) {
              parser->file_data->flags |= CURLFINFOFLAG_KNOWN_TIME;
            }
            if(finfo->filetype == CURLFILETYPE_SYMLINK) {
              parser->state.UNIX.main = PL_UNIX_SYMLINK;
              parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRESPACE;
            }
            else {
              parser->state.UNIX.main = PL_UNIX_FILENAME;
              parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_PRESPACE;
            }
          }
          else if(!ISALNUM(c) && c != '.' && c != ':') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      case PL_UNIX_FILENAME:
        switch(parser->state.UNIX.sub.filename) {
        case PL_UNIX_FILENAME_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_NAME;
          }
          break;
        case PL_UNIX_FILENAME_NAME:
          parser->item_length++;
          if(c == '\r') {
            parser->item_length--;
            parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_WINDOWSEOL;
          }
          else if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            rc = ftp_pl_insert_finfo(conn, finfo);
            if(rc) {
              PL_ERROR(conn, rc);
              return bufflen;
            }
          }
          break;
        case PL_UNIX_FILENAME_WINDOWSEOL:
          if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            rc = ftp_pl_insert_finfo(conn, finfo);
            if(rc) {
              PL_ERROR(conn, rc);
              return bufflen;
            }
          }
          else {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      case PL_UNIX_SYMLINK:
        switch(parser->state.UNIX.sub.symlink) {
        case PL_UNIX_SYMLINK_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_NAME:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET1;
          }
          else if(c == '\r' || c == '\n') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET1:
          parser->item_length++;
          if(c == '-') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET2;
          }
          else if(c == '\r' || c == '\n') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET2:
          parser->item_length++;
          if(c == '>') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET3;
          }
          else if(c == '\r' || c == '\n') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET3:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET4;
            /* now place where is symlink following */
            finfo->b_data[parser->item_offset + parser->item_length - 4] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->item_length = 0;
            parser->item_offset = 0;
          }
          else if(c == '\r' || c == '\n') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET4:
          if(c != '\r' && c != '\n') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_TARGET;
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
          }
          else {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        case PL_UNIX_SYMLINK_TARGET:
          parser->item_length ++;
          if(c == '\r') {
            parser->item_length --;
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_WINDOWSEOL;
          }
          else if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.symlink_target = parser->item_offset;
            rc = ftp_pl_insert_finfo(conn, finfo);
            if(rc) {
              PL_ERROR(conn, rc);
              return bufflen;
            }
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
          }
          break;
        case PL_UNIX_SYMLINK_WINDOWSEOL:
          if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.symlink_target = parser->item_offset;
            rc = ftp_pl_insert_finfo(conn, finfo);
            if(rc) {
              PL_ERROR(conn, rc);
              return bufflen;
            }
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
          }
          else {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      }
      break;
    case OS_TYPE_WIN_NT:
      switch(parser->state.NT.main) {
      case PL_WINNT_DATE:
        parser->item_length++;
        if(parser->item_length < 9) {
          if(!strchr("0123456789-", c)) { /* only simple control */
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
        }
        else if(parser->item_length == 9) {
          if(c == ' ') {
            parser->state.NT.main = PL_WINNT_TIME;
            parser->state.NT.sub.time = PL_WINNT_TIME_PRESPACE;
          }
          else {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
        }
        else {
          PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
          return bufflen;
        }
        break;
      case PL_WINNT_TIME:
        parser->item_length++;
        switch(parser->state.NT.sub.time) {
        case PL_WINNT_TIME_PRESPACE:
          if(!ISSPACE(c)) {
            parser->state.NT.sub.time = PL_WINNT_TIME_TIME;
          }
          break;
        case PL_WINNT_TIME_TIME:
          if(c == ' ') {
            parser->offsets.time = parser->item_offset;
            finfo->b_data[parser->item_offset + parser->item_length -1] = 0;
            parser->state.NT.main = PL_WINNT_DIRORSIZE;
            parser->state.NT.sub.dirorsize = PL_WINNT_DIRORSIZE_PRESPACE;
            parser->item_length = 0;
          }
          else if(!strchr("APM0123456789:", c)) {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      case PL_WINNT_DIRORSIZE:
        switch(parser->state.NT.sub.dirorsize) {
        case PL_WINNT_DIRORSIZE_PRESPACE:
          if(c == ' ') {

          }
          else {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.NT.sub.dirorsize = PL_WINNT_DIRORSIZE_CONTENT;
          }
          break;
        case PL_WINNT_DIRORSIZE_CONTENT:
          parser->item_length ++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            if(strcmp("<DIR>", finfo->b_data + parser->item_offset) == 0) {
              finfo->filetype = CURLFILETYPE_DIRECTORY;
              finfo->size = 0;
            }
            else {
              char *endptr;
              finfo->size = curlx_strtoofft(finfo->b_data +
                                            parser->item_offset,
                                            &endptr, 10);
              if(!*endptr) {
                if(finfo->size == CURL_OFF_T_MAX ||
                   finfo->size == CURL_OFF_T_MIN) {
                  if(errno == ERANGE) {
                    PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
                    return bufflen;
                  }
                }
              }
              else {
                PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
                return bufflen;
              }
              /* correct file type */
              parser->file_data->filetype = CURLFILETYPE_FILE;
            }

            parser->file_data->flags |= CURLFINFOFLAG_KNOWN_SIZE;
            parser->item_length = 0;
            parser->state.NT.main = PL_WINNT_FILENAME;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          break;
        }
        break;
      case PL_WINNT_FILENAME:
        switch (parser->state.NT.sub.filename) {
        case PL_WINNT_FILENAME_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used -1;
            parser->item_length = 1;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_CONTENT;
          }
          break;
        case PL_WINNT_FILENAME_CONTENT:
          parser->item_length++;
          if(c == '\r') {
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_WINEOL;
            finfo->b_data[finfo->b_used - 1] = 0;
          }
          else if(c == '\n') {
            parser->offsets.filename = parser->item_offset;
            finfo->b_data[finfo->b_used - 1] = 0;
            parser->offsets.filename = parser->item_offset;
            rc = ftp_pl_insert_finfo(conn, finfo);
            if(rc) {
              PL_ERROR(conn, rc);
              return bufflen;
            }
            parser->state.NT.main = PL_WINNT_DATE;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          break;
        case PL_WINNT_FILENAME_WINEOL:
          if(c == '\n') {
            parser->offsets.filename = parser->item_offset;
            rc = ftp_pl_insert_finfo(conn, finfo);
            if(rc) {
              PL_ERROR(conn, rc);
              return bufflen;
            }
            parser->state.NT.main = PL_WINNT_DATE;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          else {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      }
      break;
    default:
      return bufflen+1;
    }

    i++;
  }

  return bufflen;
}